

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::getTimingTagsKernel
          (CLIntercept *this,cl_command_queue queue,cl_kernel kernel,cl_uint workDim,size_t *gwo,
          size_t *gws,size_t *lws,string *hostTag,string *deviceTag)

{
  _Rb_tree_header *p_Var1;
  cl_api_clGetKernelSubGroupInfo p_Var2;
  cl_platform_id platform_00;
  _Alloc_hider platform_01;
  int iVar3;
  cl_int cVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  mapped_type *pmVar8;
  undefined8 uVar9;
  cl_uint cVar10;
  size_t sVar11;
  _Base_ptr p_Var12;
  size_t *psVar13;
  ulong uVar14;
  CLdispatchXMap *pCVar15;
  bool bVar16;
  pthread_mutex_t *local_248;
  cl_device_id device;
  cl_platform_id platform;
  _cl_platform_id local_228 [16];
  CLdispatchXMap *local_218;
  size_t *local_210;
  size_t *local_208;
  size_t *local_200;
  size_t maxsgs;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  CLdispatchXMap *local_1e0;
  mapped_type *local_1d8;
  cl_command_queue local_1d0;
  size_t pwgsm;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  size_t kwgs;
  ostringstream ss;
  _cl_platform_id local_198 [96];
  ios_base local_138 [264];
  
  local_210 = gwo;
  local_208 = gws;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar3 == 0) {
    device = (cl_device_id)0x0;
    local_1d0 = queue;
    (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1091,8,&device,(size_t *)0x0);
    cacheDeviceInfo(this,device);
    if (kernel != (cl_kernel)0x0) {
      getShortKernelNameWithHash_abi_cxx11_((string *)&ss,this,kernel);
      std::__cxx11::string::_M_append((char *)hostTag,(ulong)_ss);
      if ((_cl_platform_id *)_ss != local_198) {
        operator_delete(_ss);
      }
      std::__cxx11::string::_M_append((char *)deviceTag,(ulong)(hostTag->_M_dataplus)._M_p);
      local_200 = lws;
      if (((this->m_Config).DevicePerformanceTimeKernelInfoTracking == true) &&
         (device != (cl_device_id)0x0)) {
        pmVar5 = std::
                 map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
                 ::operator[](&this->m_DeviceInfoMap,&device);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        maxsgs = 0;
        pwgsm = 0;
        kwgs = 0;
        psVar13 = lws;
        cVar10 = workDim;
        if (lws == (size_t *)0x0) {
          psVar13 = &kwgs;
          (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                    (kernel,device,0x11b0,8,psVar13,(size_t *)0x0);
          cVar10 = 1;
        }
        if ((maxsgs == 0) && (pmVar5->Supports_cl_khr_subgroups == true)) {
          local_218 = (CLdispatchXMap *)CONCAT44(local_218._4_4_,cVar10);
          platform = (cl_platform_id)0x0;
          local_1d8 = pmVar5;
          (*(this->m_Dispatch).clGetDeviceInfo)(device,0x1031,8,&platform,(size_t *)0x0);
          platform_00 = platform;
          p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var12 = &p_Var1->_M_header;
          for (; p_Var6 != (_Base_ptr)0x0;
              p_Var6 = (&p_Var6->_M_left)[*(cl_platform_id *)(p_Var6 + 1) < platform]) {
            if (*(cl_platform_id *)(p_Var6 + 1) >= platform) {
              p_Var12 = p_Var6;
            }
          }
          p_Var6 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
             (p_Var6 = p_Var12, platform < *(cl_platform_id *)(p_Var12 + 1))) {
            p_Var6 = &p_Var1->_M_header;
          }
          pCVar15 = &this->m_DispatchX;
          if ((_Rb_tree_header *)p_Var6 == p_Var1) {
            platform = (cl_platform_id)0x0;
            local_1e0 = pCVar15;
            pmVar8 = std::
                     map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                     ::at(pCVar15,&platform);
            pCVar15 = local_1e0;
          }
          else {
            pmVar8 = (mapped_type *)&p_Var6[1]._M_parent;
          }
          if (pmVar8->clGetKernelSubGroupInfoKHR ==
              (_func_cl_int_cl_kernel_cl_device_id_cl_kernel_sub_group_info_size_t_void_ptr_size_t_void_ptr_size_t_ptr
               *)0x0) {
            platform = local_228;
            local_1e0 = pCVar15;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&platform,"clGetKernelSubGroupInfoKHR","");
            getExtensionFunctionAddress(this,platform_00,(string *)&platform);
            pCVar15 = local_1e0;
            if (platform != local_228) {
              operator_delete(platform);
              pCVar15 = local_1e0;
            }
          }
          p_Var6 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var12 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[*(cl_platform_id *)(p_Var6 + 1) < platform_00]) {
            if (*(cl_platform_id *)(p_Var6 + 1) >= platform_00) {
              p_Var12 = p_Var6;
            }
          }
          p_Var7 = p_Var1;
          if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
             (p_Var7 = (_Rb_tree_header *)p_Var12,
             platform_00 < (cl_platform_id)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
            p_Var7 = p_Var1;
          }
          if (p_Var7 == p_Var1) {
            platform = (cl_platform_id)0x0;
            pmVar8 = std::
                     map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                     ::at(pCVar15,&platform);
          }
          else {
            pmVar8 = (mapped_type *)(p_Var7 + 1);
          }
          pmVar5 = local_1d8;
          cVar10 = (uint)local_218;
          if (pmVar8->clGetKernelSubGroupInfoKHR !=
              (_func_cl_int_cl_kernel_cl_device_id_cl_kernel_sub_group_info_size_t_void_ptr_size_t_void_ptr_size_t_ptr
               *)0x0) {
            (*pmVar8->clGetKernelSubGroupInfoKHR)
                      (kernel,device,0x2033,((ulong)local_218 & 0xffffffff) << 3,psVar13,8,&maxsgs,
                       (size_t *)0x0);
            cVar10 = (uint)local_218;
          }
        }
        if (((maxsgs == 0) && (0x800fff < pmVar5->NumericVersion)) &&
           (p_Var2 = (this->m_Dispatch).clGetKernelSubGroupInfo,
           p_Var2 != (cl_api_clGetKernelSubGroupInfo)0x0)) {
          (*p_Var2)(kernel,device,0x2033,(ulong)cVar10 << 3,psVar13,8,&maxsgs,(size_t *)0x0);
        }
        (*(this->m_Dispatch).clGetKernelWorkGroupInfo)(kernel,device,0x11b3,8,&pwgsm,(size_t *)0x0);
        sVar11 = maxsgs;
        if (maxsgs == 0) {
          sVar11 = pwgsm;
        }
        if (pwgsm == 0) {
          pwgsm = maxsgs;
        }
        uVar14 = pwgsm;
        if (sVar11 < pwgsm) {
          uVar14 = sVar11;
        }
        maxsgs = sVar11;
        if (uVar14 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," SIMD",5);
          std::ostream::_M_insert<unsigned_long>((ulong)&ss);
        }
        platform = (cl_platform_id)((ulong)platform & 0xffffffff00000000);
        (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                  (kernel,device,0x425b,4,&platform,(size_t *)0x0);
        if ((int)platform != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," REG",4);
          std::ostream::_M_insert<unsigned_long>((ulong)&ss);
        }
        platform = (cl_platform_id)0x0;
        (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                  (kernel,device,0x11b2,8,&platform,(size_t *)0x0);
        if (platform != (cl_platform_id)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," SLM=",5);
          std::ostream::_M_insert<unsigned_long>((ulong)&ss);
        }
        platform = (cl_platform_id)0x0;
        (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                  (kernel,device,0x11b4,8,&platform,(size_t *)0x0);
        if (platform != (cl_platform_id)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," TPM=",5);
          std::ostream::_M_insert<unsigned_long>((ulong)&ss);
        }
        platform = (cl_platform_id)0x0;
        (*(this->m_Dispatch).clGetKernelWorkGroupInfo)
                  (kernel,device,0x4109,8,&platform,(size_t *)0x0);
        if (platform != (cl_platform_id)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," SPILL=",7);
          std::ostream::_M_insert<unsigned_long>((ulong)&ss);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)deviceTag,(ulong)platform);
        if (platform != local_228) {
          operator_delete(platform);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
      if ((this->m_Config).DevicePerformanceTimeGWOTracking == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," GWO[ ",6);
        if (local_210 == (size_t *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,"NULL",4);
        }
        else {
          if (workDim != 0) {
            std::ostream::_M_insert<unsigned_long>((ulong)&ss);
          }
          if (1 < workDim) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,", ",2);
            std::ostream::_M_insert<unsigned_long>((ulong)&ss);
          }
          if (2 < workDim) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,", ",2);
            std::ostream::_M_insert<unsigned_long>((ulong)&ss);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," ]",2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)deviceTag,(ulong)platform);
        if (platform != local_228) {
          operator_delete(platform);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
      if ((local_208 != (size_t *)0x0) &&
         ((this->m_Config).DevicePerformanceTimeGWSTracking != false)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," GWS[ ",6);
        if (workDim != 0) {
          std::ostream::_M_insert<unsigned_long>((ulong)&ss);
        }
        if (1 < workDim) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," x ",3);
          std::ostream::_M_insert<unsigned_long>((ulong)&ss);
        }
        if (2 < workDim) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," x ",3);
          std::ostream::_M_insert<unsigned_long>((ulong)&ss);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," ]",2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)deviceTag,(ulong)platform);
        if (platform != local_228) {
          operator_delete(platform);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
      if ((this->m_Config).DevicePerformanceTimeLWSTracking == true) {
        maxsgs = 0;
        uStack_1f0 = 0;
        bVar16 = false;
        local_1e8 = 0;
        local_1b8 = 0;
        pwgsm = 0;
        uStack_1c0 = 0;
        if (workDim < 4 && lws == (size_t *)0x0) {
          if ((this->m_Config).DevicePerformanceTimeSuggestedLWSTracking == true) {
            _ss = (pointer)0x0;
            (*(this->m_Dispatch).clGetDeviceInfo)(device,0x1031,8,&ss,(size_t *)0x0);
            platform_01._M_p = _ss;
            p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
            p_Var6 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var12 = &p_Var1->_M_header;
            for (; p_Var6 != (_Base_ptr)0x0;
                p_Var6 = (&p_Var6->_M_left)[*(cl_platform_id *)(p_Var6 + 1) < _ss]) {
              if (*(cl_platform_id *)(p_Var6 + 1) >= _ss) {
                p_Var12 = p_Var6;
              }
            }
            p_Var6 = &p_Var1->_M_header;
            if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
               (p_Var6 = p_Var12, _ss < *(cl_platform_id *)(p_Var12 + 1))) {
              p_Var6 = &p_Var1->_M_header;
            }
            local_218 = &this->m_DispatchX;
            if ((_Rb_tree_header *)p_Var6 == p_Var1) {
              _ss = (pointer)0x0;
              pmVar8 = std::
                       map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                       ::at(local_218,(key_type *)&ss);
            }
            else {
              pmVar8 = (mapped_type *)&p_Var6[1]._M_parent;
            }
            pCVar15 = local_218;
            if (pmVar8->clGetKernelSuggestedLocalWorkSizeKHR ==
                (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)
                0x0) {
              _ss = (pointer)local_198;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&ss,"clGetKernelSuggestedLocalWorkSizeKHR","");
              getExtensionFunctionAddress(this,(cl_platform_id)platform_01._M_p,(string *)&ss);
              if ((_cl_platform_id *)_ss != local_198) {
                operator_delete(_ss);
              }
            }
            p_Var6 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var12 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
                p_Var6 = (&p_Var6->_M_left)[*(cl_platform_id *)(p_Var6 + 1) < platform_01._M_p]) {
              if (*(cl_platform_id *)(p_Var6 + 1) >= platform_01._M_p) {
                p_Var12 = p_Var6;
              }
            }
            p_Var7 = p_Var1;
            if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
               (p_Var7 = (_Rb_tree_header *)p_Var12,
               platform_01._M_p < (cl_platform_id)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
              p_Var7 = p_Var1;
            }
            if (p_Var7 == p_Var1) {
              _ss = (pointer)0x0;
              pmVar8 = std::
                       map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                       ::at(pCVar15,(key_type *)&ss);
            }
            else {
              pmVar8 = (mapped_type *)(p_Var7 + 1);
            }
            if (pmVar8->clGetKernelSuggestedLocalWorkSizeKHR ==
                (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr *)
                0x0) {
              bVar16 = false;
            }
            else {
              cVar4 = (*pmVar8->clGetKernelSuggestedLocalWorkSizeKHR)
                                (local_1d0,kernel,workDim,local_210,local_208,&maxsgs);
              bVar16 = cVar4 == 0;
            }
            if (!bVar16) {
              p_Var6 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var12 = &p_Var1->_M_header;
              for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
                  p_Var6 = (&p_Var6->_M_left)[*(cl_platform_id *)(p_Var6 + 1) < platform_01._M_p]) {
                if (*(cl_platform_id *)(p_Var6 + 1) >= platform_01._M_p) {
                  p_Var12 = p_Var6;
                }
              }
              p_Var7 = p_Var1;
              if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
                 (p_Var7 = (_Rb_tree_header *)p_Var12,
                 platform_01._M_p < (cl_platform_id)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
                p_Var7 = p_Var1;
              }
              if (p_Var7 == p_Var1) {
                _ss = (pointer)0x0;
                pmVar8 = std::
                         map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                         ::at(local_218,(key_type *)&ss);
              }
              else {
                pmVar8 = (mapped_type *)(p_Var7 + 1);
              }
              if (pmVar8->clGetKernelSuggestedLocalWorkSizeINTEL ==
                  (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr
                   *)0x0) {
                _ss = (pointer)local_198;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&ss,"clGetKernelSuggestedLocalWorkSizeINTEL","");
                getExtensionFunctionAddress(this,(cl_platform_id)platform_01._M_p,(string *)&ss);
                if ((_cl_platform_id *)_ss != local_198) {
                  operator_delete(_ss);
                }
              }
              p_Var6 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var12 = &p_Var1->_M_header;
              for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
                  p_Var6 = (&p_Var6->_M_left)[*(cl_platform_id *)(p_Var6 + 1) < platform_01._M_p]) {
                if (*(cl_platform_id *)(p_Var6 + 1) >= platform_01._M_p) {
                  p_Var12 = p_Var6;
                }
              }
              p_Var7 = p_Var1;
              if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
                 (p_Var7 = (_Rb_tree_header *)p_Var12,
                 platform_01._M_p < (cl_platform_id)((_Rb_tree_header *)p_Var12)->_M_node_count)) {
                p_Var7 = p_Var1;
              }
              if (p_Var7 == p_Var1) {
                _ss = (pointer)0x0;
                pmVar8 = std::
                         map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
                         ::at(local_218,(key_type *)&ss);
              }
              else {
                pmVar8 = (mapped_type *)(p_Var7 + 1);
              }
              if (pmVar8->clGetKernelSuggestedLocalWorkSizeINTEL !=
                  (_func_cl_int_cl_command_queue_cl_kernel_cl_uint_size_t_ptr_size_t_ptr_size_t_ptr
                   *)0x0) {
                psVar13 = &pwgsm;
                if (local_210 != (size_t *)0x0) {
                  psVar13 = local_210;
                }
                cVar4 = (*pmVar8->clGetKernelSuggestedLocalWorkSizeINTEL)
                                  (local_1d0,kernel,workDim,psVar13,local_208,&maxsgs);
                bVar16 = cVar4 == 0;
              }
            }
          }
          else {
            bVar16 = false;
          }
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        if (bVar16) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," SLWS[ ",7);
          local_200 = &maxsgs;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," LWS[ ",6);
        }
        if (local_200 == (size_t *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,"NULL",4);
        }
        else {
          if (workDim != 0) {
            std::ostream::_M_insert<unsigned_long>((ulong)&ss);
          }
          if (1 < workDim) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," x ",3);
            std::ostream::_M_insert<unsigned_long>((ulong)&ss);
          }
          if (2 < workDim) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," x ",3);
            std::ostream::_M_insert<unsigned_long>((ulong)&ss);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss," ]",2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)deviceTag,(ulong)platform);
        if (platform != local_228) {
          operator_delete(platform);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    return;
  }
  uVar9 = std::__throw_system_error(iVar3);
  if ((_cl_platform_id *)_ss != local_198) {
    operator_delete(_ss);
  }
  pthread_mutex_unlock(local_248);
  _Unwind_Resume(uVar9);
}

Assistant:

void CLIntercept::getTimingTagsKernel(
    const cl_command_queue queue,
    const cl_kernel kernel,
    const cl_uint workDim,
    const size_t* gwo,
    const size_t* gws,
    const size_t* lws,
    std::string& hostTag,
    std::string& deviceTag )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_device_id device = NULL;
    dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL );

    // Cache the device info if it's not cached already, since we'll print
    // the device name and other device properties as part of the report.
    cacheDeviceInfo( device );

    if( kernel )
    {
        hostTag += getShortKernelNameWithHash(kernel);

        deviceTag += hostTag;

        if( config().DevicePerformanceTimeKernelInfoTracking && device )
        {
            const SDeviceInfo& deviceInfo = m_DeviceInfoMap[device];

            std::ostringstream  ss;
            {
                size_t  maxsgs = 0;
                size_t  pwgsm = 0;
                size_t  simd = 0;

                // Use the kernel "max subgroup size" and "preferred work
                // group size multiple" to get a reasonable estimate of
                // the kernel "SIMD size".  We'll try to query both values,
                // and if both queries are successful, we'll pick the
                // smallest one.  Empirically, this is reasonably accurate.

                // First, query the "max subgroup size":

                // The query for the max subgroup size requires passing in
                // a local work size.  We'll use the local work size provided
                // by the app if there is one, otherwise we will query the
                // max local work size for this kernel and use it.
                const size_t*   queryLWS = lws;
                cl_uint queryWorkDim = workDim;

                size_t  kwgs = 0;
                if( queryLWS == NULL )
                {
                    dispatch().clGetKernelWorkGroupInfo(
                        kernel,
                        device,
                        CL_KERNEL_WORK_GROUP_SIZE,
                        sizeof(kwgs),
                        &kwgs,
                        NULL );
                    queryLWS = &kwgs;
                    queryWorkDim = 1;
                }

                if( maxsgs == 0 &&
                    deviceInfo.Supports_cl_khr_subgroups )
                {
                    cl_platform_id  platform = getPlatform(device);
                    if( dispatchX(platform).clGetKernelSubGroupInfoKHR == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSubGroupInfoKHR" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSubGroupInfoKHR )
                    {
                        dispatchX.clGetKernelSubGroupInfoKHR(
                            kernel,
                            device,
                            CL_KERNEL_MAX_SUB_GROUP_SIZE_FOR_NDRANGE_KHR,
                            queryWorkDim * sizeof(queryLWS[0]),
                            queryLWS,
                            sizeof(maxsgs),
                            &maxsgs,
                            NULL );
                    }
                }
                if( maxsgs == 0 &&
                    deviceInfo.NumericVersion >= CL_MAKE_VERSION_KHR(2, 1, 0) &&
                    dispatch().clGetKernelSubGroupInfo )
                {
                    dispatch().clGetKernelSubGroupInfo(
                        kernel,
                        device,
                        CL_KERNEL_MAX_SUB_GROUP_SIZE_FOR_NDRANGE,
                        queryWorkDim * sizeof(queryLWS[0]),
                        queryLWS,
                        sizeof(maxsgs),
                        &maxsgs,
                        NULL );
                }

                // Next, query the "preferred work group size multiple":

                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_PREFERRED_WORK_GROUP_SIZE_MULTIPLE,
                    sizeof(pwgsm),
                    &pwgsm,
                    NULL );

                // If either query is zero, use the other query.
                // Otherwise, use the smallest query.

                maxsgs = ( maxsgs == 0 ) ? pwgsm : maxsgs;
                pwgsm = ( pwgsm == 0 ) ? maxsgs : pwgsm;
                simd = ( maxsgs < pwgsm ) ? maxsgs : pwgsm;

                if( simd )
                {
                    ss << " SIMD" << simd;
                }
            }
            {
                cl_uint regCount = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_REGISTER_COUNT_INTEL,
                    sizeof(regCount),
                    &regCount,
                    NULL );
                if( regCount )
                {
                    ss << " REG" << regCount;
                }
            }
            {
                cl_ulong slm = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_LOCAL_MEM_SIZE,
                    sizeof(slm),
                    &slm,
                    NULL );
                if( slm )
                {
                    ss << " SLM=" << slm;
                }
            }
            {
                cl_ulong tpm = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_PRIVATE_MEM_SIZE,
                    sizeof(tpm),
                    &tpm,
                    NULL );
                if( tpm )
                {
                    ss << " TPM=" << tpm;
                }
            }
            {
                cl_ulong spill = 0;
                dispatch().clGetKernelWorkGroupInfo(
                    kernel,
                    device,
                    CL_KERNEL_SPILL_MEM_SIZE_INTEL,
                    sizeof(spill),
                    &spill,
                    NULL );
                if( spill )
                {
                    ss << " SPILL=" << spill;
                }
            }
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeGWOTracking )
        {
            std::ostringstream  ss;
            ss << " GWO[ ";
            if( gwo )
            {
                if( workDim >= 1 )
                {
                    ss << gwo[0];
                }
                if( workDim >= 2 )
                {
                    ss << ", " << gwo[1];
                }
                if( workDim >= 3 )
                {
                    ss << ", " << gwo[2];
                }
            }
            else
            {
                ss << "NULL";
            }
            ss << " ]";
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeGWSTracking && gws )
        {
            std::ostringstream  ss;
            ss << " GWS[ ";
            if( workDim >= 1 )
            {
                ss << gws[0];
            }
            if( workDim >= 2 )
            {
                ss << " x " << gws[1];
            }
            if( workDim >= 3 )
            {
                ss << " x " << gws[2];
            }
            ss << " ]";
            deviceTag += ss.str();
        }

        if( config().DevicePerformanceTimeLWSTracking )
        {
            bool    useSuggestedLWS = false;
            size_t  suggestedLWS[3] = { 0, 0, 0 };
            size_t  emptyGWO[3] = { 0, 0, 0 };

            if( lws == NULL &&
                workDim <= 3 &&
                config().DevicePerformanceTimeSuggestedLWSTracking )
            {
                cl_platform_id  platform = getPlatform(device);

                // Try the cl_khr_suggested_local_work_size version first.
                if( useSuggestedLWS == false )
                {
                    if( dispatchX(platform).clGetKernelSuggestedLocalWorkSizeKHR == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSuggestedLocalWorkSizeKHR" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSuggestedLocalWorkSizeKHR )
                    {
                        cl_int testErrorCode = dispatchX.clGetKernelSuggestedLocalWorkSizeKHR(
                            queue,
                            kernel,
                            workDim,
                            gwo,
                            gws,
                            suggestedLWS );
                        useSuggestedLWS = ( testErrorCode == CL_SUCCESS );
                    }
                }

                // If this fails, try the unofficial Intel version next.
                if( useSuggestedLWS == false )
                {
                    if( dispatchX(platform).clGetKernelSuggestedLocalWorkSizeINTEL == NULL )
                    {
                        getExtensionFunctionAddress(
                            platform,
                            "clGetKernelSuggestedLocalWorkSizeINTEL" );
                    }

                    const auto& dispatchX = this->dispatchX(platform);
                    if( dispatchX.clGetKernelSuggestedLocalWorkSizeINTEL )
                    {
                        cl_int testErrorCode = dispatchX.clGetKernelSuggestedLocalWorkSizeINTEL(
                            queue,
                            kernel,
                            workDim,
                            gwo == NULL ? emptyGWO : gwo,
                            gws,
                            suggestedLWS );
                        useSuggestedLWS = ( testErrorCode == CL_SUCCESS );
                    }
                }
            }

            std::ostringstream  ss;
            if( useSuggestedLWS )
            {
                ss << " SLWS[ ";
                lws = suggestedLWS;
            }
            else
            {
                ss << " LWS[ ";
            }

            if( lws )
            {
                if( workDim >= 1 )
                {
                    ss << lws[0];
                }
                if( workDim >= 2 )
                {
                    ss << " x " << lws[1];
                }
                if( workDim >= 3 )
                {
                    ss << " x " << lws[2];
                }
            }
            else
            {
                ss << "NULL";
            }

            ss << " ]";
            deviceTag += ss.str();
        }
    }
}